

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeSuspend(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name tag)

{
  char **this_00;
  Name tag_00;
  Name name;
  Tag *this_01;
  size_t size;
  Suspend *expr;
  Ok local_149;
  IRBuilder *local_148;
  size_t sStack_140;
  allocator<wasm::Expression_*> local_129;
  Iterator local_128;
  Iterator local_118;
  undefined1 local_108 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> operands;
  Err local_e8;
  Err *local_b8;
  Err *err;
  Result<wasm::Ok> _val;
  Type local_70;
  undefined1 local_68 [8];
  Suspend curr;
  IRBuilder *this_local;
  Name tag_local;
  
  tag_local.super_IString.str._M_len = tag.super_IString.str._M_str;
  this_local = tag.super_IString.str._M_len;
  curr.operands.allocator = (MixedArena *)this;
  tag_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  Suspend::Suspend((Suspend *)local_68,&this->wasm->allocator);
  wasm::Name::operator=
            ((Name *)&curr.super_SpecificExpression<(wasm::Expression::Id)92>.super_Expression.type,
             (Name *)&this_local);
  _val.val.super__Variant_base<wasm::Ok,_wasm::Err>.super__Move_assign_alias<wasm::Ok,_wasm::Err>.
  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
  super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.super__Variant_storage_alias<wasm::Ok,_wasm::Err>.
  _32_8_ = this_local;
  name.super_IString.str._M_str = (char *)tag_local.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)this_local;
  this_01 = Module::getTag(this->wasm,name);
  local_70 = wasm::Tag::params(this_01);
  size = wasm::Type::size(&local_70);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
            ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
             &curr.tag.super_IString.str._M_str,size);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitSuspend
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,
             (Suspend *)local_68);
  local_b8 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_1_ = local_b8 != (Err *)0x0;
  if (operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_1_) {
    wasm::Err::Err(&local_e8,local_b8);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_e8);
    wasm::Err::~Err(&local_e8);
  }
  operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    this_00 = &curr.tag.super_IString.str._M_str;
    local_118 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::begin
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           this_00);
    local_128 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::end
                          ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                           this_00);
    std::allocator<wasm::Expression_*>::allocator(&local_129);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    vector<ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::Iterator,void>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)local_108,local_118,
               local_128,&local_129);
    std::allocator<wasm::Expression_*>::~allocator(&local_129);
    local_148 = this_local;
    sStack_140 = tag_local.super_IString.str._M_len;
    tag_00.super_IString.str._M_str = (char *)tag_local.super_IString.str._M_len;
    tag_00.super_IString.str._M_len = (size_t)this_local;
    expr = Builder::makeSuspend
                     (&this->builder,tag_00,
                      (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_108);
    push(this,(Expression *)expr);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_149);
    operands.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)local_108);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeSuspend(Name tag) {
  Suspend curr(wasm.allocator);
  curr.tag = tag;
  curr.operands.resize(wasm.getTag(tag)->params().size());
  CHECK_ERR(visitSuspend(&curr));

  std::vector<Expression*> operands(curr.operands.begin(), curr.operands.end());
  push(builder.makeSuspend(tag, operands));
  return Ok{};
}